

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_parser.h
# Opt level: O0

Ref<embree::XML> __thiscall embree::XML::child(XML *this,size_t id)

{
  size_type sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ulong in_RDX;
  long in_RSI;
  XML *in_RDI;
  char *in_stack_fffffffffffffee0;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  longlong in_stack_ffffffffffffff28;
  ParseLocation *in_stack_ffffffffffffff88;
  string local_58 [32];
  size_type local_38;
  const_reference local_20;
  size_type local_10;
  undefined1 *local_8;
  
  local_38 = in_RDX;
  sVar1 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::size
                    ((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_> *
                     )(in_RSI + 0x80));
  if (sVar1 <= in_RDX) {
    uVar2 = 1;
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x10);
    ParseLocation::str_abi_cxx11_(in_stack_ffffffffffffff88);
    std::operator+(__lhs,in_stack_fffffffffffffee0);
    local_8 = &stack0xffffffffffffff18;
    local_10 = local_38;
    std::__cxx11::to_string(in_stack_ffffffffffffff28);
    std::operator+(in_stack_ffffffffffffff18,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(uVar2,in_stack_ffffffffffffff10));
    std::operator+(__lhs,in_stack_fffffffffffffee0);
    std::runtime_error::runtime_error((runtime_error *)__lhs,local_58);
    __cxa_throw(__lhs,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_20 = std::vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>::
             operator[]((vector<embree::Ref<embree::XML>,_std::allocator<embree::Ref<embree::XML>_>_>
                         *)(in_RSI + 0x80),local_38);
  (in_RDI->super_RefCount)._vptr_RefCount = (_func_int **)local_20->ptr;
  if ((in_RDI->super_RefCount)._vptr_RefCount != (_func_int **)0x0) {
    (**(code **)(*(in_RDI->super_RefCount)._vptr_RefCount + 0x10))();
  }
  return (Ref<embree::XML>)in_RDI;
}

Assistant:

const Ref<XML> child(const size_t id) const 
    {
      if (id >= children.size()) 
        THROW_RUNTIME_ERROR (loc.str()+": XML node has no child \"" + toString(id) + "\"");
      return children[id];
    }